

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

int Gia_ManLutLevel(Gia_Man_t *p)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  void *__ptr;
  long lVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  size_t __nmemb;
  
  iVar2 = p->nObjs;
  __nmemb = (size_t)iVar2;
  __ptr = calloc(__nmemb,4);
  if (1 < (long)__nmemb) {
    pVVar7 = p->vMapping;
    uVar3 = pVVar7->nSize;
    uVar11 = 1;
    if (1 < (int)uVar3) {
      uVar11 = (ulong)uVar3;
    }
    uVar13 = 1;
    do {
      if (uVar13 == uVar11) {
LAB_006b3e86:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar8 = pVVar7->pArray;
      uVar4 = piVar8[uVar13];
      if ((ulong)uVar4 != 0) {
        if ((int)uVar3 <= (int)uVar4 || (int)uVar4 < 0) goto LAB_006b3e86;
        puVar1 = (uint *)(piVar8 + uVar4);
        uVar5 = *puVar1;
        uVar15 = 0;
        uVar14 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar14 = uVar15;
        }
        iVar10 = 0;
        while (uVar14 != uVar15) {
          iVar6 = *(int *)((long)__ptr + (long)(int)puVar1[uVar15 + 1] * 4);
          if (iVar10 <= iVar6) {
            iVar10 = iVar6;
          }
          uVar15 = uVar15 + 1;
          if ((int)uVar3 <= (int)uVar4 || (int)uVar4 < 0) goto LAB_006b3e86;
        }
        *(int *)((long)__ptr + uVar13 * 4) = iVar10 + 1;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != __nmemb);
  }
  lVar9 = (long)p->vCos->nSize;
  if (lVar9 < 1) {
    iVar10 = 0;
  }
  else {
    lVar12 = 0;
    iVar10 = 0;
    do {
      iVar6 = p->vCos->pArray[lVar12];
      if (((long)iVar6 < 0) || (iVar2 <= iVar6)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      iVar6 = *(int *)((long)__ptr +
                      (long)(int)(iVar6 - (*(uint *)(p->pObjs + iVar6) & 0x1fffffff)) * 4);
      if (iVar10 <= iVar6) {
        iVar10 = iVar6;
      }
      lVar12 = lVar12 + 1;
    } while (lVar9 != lVar12);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return iVar10;
}

Assistant:

int Gia_ManLutLevel( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, k, iFan, Level;
    int * pLevels = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachLut( p, i )
    {
        Level = 0;
        Gia_LutForEachFanin( p, i, iFan, k )
            if ( Level < pLevels[iFan] )
                Level = pLevels[iFan];
        pLevels[i] = Level + 1;
    }
    Level = 0;
    Gia_ManForEachCo( p, pObj, k )
        if ( Level < pLevels[Gia_ObjFaninId0p(p, pObj)] )
            Level = pLevels[Gia_ObjFaninId0p(p, pObj)];
    ABC_FREE( pLevels );
    return Level;
}